

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O2

Var __thiscall
Js::JavascriptNativeArray::FindMinOrMax<int,false>
          (JavascriptNativeArray *this,ScriptContext *scriptContext,bool findMax)

{
  uint uVar1;
  Type TVar2;
  SparseArraySegmentBase *pSVar3;
  code *pcVar4;
  bool bVar5;
  Type TVar6;
  undefined4 *puVar7;
  Var pvVar8;
  uint i;
  ulong uVar9;
  
  bVar5 = JavascriptArray::HasNoMissingValues(&this->super_JavascriptArray);
  if (!bVar5) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0xa10,"(this->HasNoMissingValues())",
                                "Fastpath is only for arrays with one segment and no missing values"
                               );
    if (!bVar5) goto LAB_00a57148;
    *puVar7 = 0;
  }
  pSVar3 = (this->super_JavascriptArray).head.ptr;
  uVar1 = pSVar3->length;
  if (uVar1 != (this->super_JavascriptArray).super_ArrayObject.length) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0xa15,"(headSegLen == len)","headSegLen == len");
    if (!bVar5) goto LAB_00a57148;
    *puVar7 = 0;
  }
  if ((pSVar3->next).ptr == (SparseArraySegmentBase *)0x0) {
    TVar6 = pSVar3[1].left;
    uVar9 = 0;
    do {
      if (uVar1 == uVar9) {
        pvVar8 = JavascriptNumber::ToVarNoCheck((double)(int)TVar6,scriptContext);
        return pvVar8;
      }
      TVar2 = (&pSVar3[1].left)[uVar9];
      if (findMax) {
        if ((int)TVar6 < (int)TVar2) {
LAB_00a570d0:
          TVar6 = TVar2;
        }
      }
      else if ((int)TVar2 < (int)TVar6) goto LAB_00a570d0;
      uVar9 = uVar9 + 1;
    } while( true );
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  *puVar7 = 1;
  bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                              ,0xa2b,"(false)",
                              "FindMinOrMax currently supports native arrays with only one segment")
  ;
  if (bVar5) {
    *puVar7 = 0;
    Throw::FatalInternalError(-0x7fffbffb);
  }
LAB_00a57148:
  pcVar4 = (code *)invalidInstructionException();
  (*pcVar4)();
}

Assistant:

Var JavascriptNativeArray::FindMinOrMax(Js::ScriptContext * scriptContext, bool findMax)
    {
        AssertMsg(this->HasNoMissingValues(), "Fastpath is only for arrays with one segment and no missing values");
        uint len = this->GetLength();

        Js::SparseArraySegment<T>* headSegment = ((Js::SparseArraySegment<T>*)this->GetHead());
        uint headSegLen = headSegment->length;
        Assert(headSegLen == len);

        if (headSegment->next == nullptr)
        {
            T currentRes = headSegment->elements[0];
            for (uint i = 0; i < headSegLen; i++)
            {
                T compare = headSegment->elements[i];
                if (checkNaNAndNegZero && JavascriptNumber::IsNan(double(compare)))
                {
                    return scriptContext->GetLibrary()->GetNaN();
                }
                if (findMax ? currentRes < compare : currentRes > compare ||
                    (checkNaNAndNegZero && compare == 0 && Js::JavascriptNumber::IsNegZero(double(currentRes))))
                {
                    currentRes = compare;
                }
            }
            return Js::JavascriptNumber::ToVarNoCheck(currentRes, scriptContext);
        }
        else
        {
            AssertMsg(false, "FindMinOrMax currently supports native arrays with only one segment");
            Throw::FatalInternalError();
        }
    }